

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price.h
# Opt level: O2

uint32_t rc_bittree_price(probability *probs,uint32_t bit_levels,uint32_t symbol)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = 0;
  uVar3 = (1 << ((byte)bit_levels & 0x1f)) + symbol;
  do {
    uVar2 = uVar3 >> 1;
    uVar1 = uVar1 + lzma_rc_prices
                    [(-(uVar3 & 1) & 0x7f0 ^
                     (uint)*(ushort *)((long)probs + (ulong)(uVar3 & 0xfffffffe))) >> 4];
    uVar3 = uVar2;
  } while (uVar2 != 1);
  return uVar1;
}

Assistant:

static inline uint32_t
rc_bittree_price(const probability *const probs,
		const uint32_t bit_levels, uint32_t symbol)
{
	uint32_t price = 0;
	symbol += UINT32_C(1) << bit_levels;

	do {
		const uint32_t bit = symbol & 1;
		symbol >>= 1;
		price += rc_bit_price(probs[symbol], bit);
	} while (symbol != 1);

	return price;
}